

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varispeed_test.c
# Opt level: O0

void varispeed_test(int converter,double target_snr)

{
  char *pcVar1;
  double dVar2;
  int local_78;
  uint local_74;
  int error;
  int input_len;
  SRC_DATA src_data;
  SRC_STATE *src_state;
  double snr;
  double sine_freq;
  double target_snr_local;
  int converter_local;
  
  sine_freq = target_snr;
  target_snr_local._4_4_ = converter;
  memset(varispeed_test::input,0,0x10000);
  local_74 = 0x2000;
  snr = 0.0111;
  gen_windowed_sines(1,&snr,1.0,varispeed_test::input,0x2000);
  src_data.src_ratio = (double)src_new(target_snr_local._4_4_,1,&local_78);
  if ((SRC_STATE *)src_data.src_ratio == (SRC_STATE *)0x0) {
    pcVar1 = src_strerror(local_78);
    printf("\n\nLine %d : src_new () failed : %s\n\n",0x62,pcVar1);
    exit(1);
  }
  src_data.output_frames_gen._0_4_ = 1;
  _error = varispeed_test::input;
  src_data.data_out = (float *)(long)(int)local_74;
  src_data.end_of_input = 0;
  src_data._52_4_ = 0x40080000;
  src_data.data_in = varispeed_test::output;
  src_data.input_frames = 0x4000;
  local_78 = src_set_ratio((SRC_STATE *)src_data.src_ratio,0.3333333333333333);
  if (local_78 != 0) {
    pcVar1 = src_strerror(local_78);
    printf("\n\nLine %d : %s\n\n",0x71,pcVar1);
    exit(1);
  }
  local_78 = src_process((SRC_STATE *)src_data.src_ratio,(SRC_DATA *)&error);
  if (local_78 != 0) {
    pcVar1 = src_strerror(local_78);
    printf("\n\nLine %d : %s\n\n",0x76,pcVar1);
    printf("  src_data.input_frames  : %ld\n",src_data.data_out);
    printf("  src_data.output_frames : %ld\n\n",src_data.input_frames);
    exit(1);
  }
  if (src_data.output_frames != (int)local_74) {
    printf("\n\nLine %d : unused input.\n",0x7d);
    printf("\tinput_len         : %d\n",(ulong)local_74);
    printf("\tinput_frames_used : %ld\n\n",src_data.output_frames);
    exit(1);
  }
  memcpy(varispeed_test::input,varispeed_test::output,0x10000);
  reverse_data(varispeed_test::input,(int)src_data.input_frames_used);
  local_78 = src_reset((SRC_STATE *)src_data.src_ratio);
  if (local_78 != 0) {
    pcVar1 = src_strerror(local_78);
    printf("\n\nLine %d : %s\n\n",0x88,pcVar1);
    exit(1);
  }
  src_data.output_frames_gen._0_4_ = 1;
  _error = varispeed_test::input;
  src_data.data_out = (float *)src_data.input_frames_used;
  local_74 = (uint)src_data.input_frames_used;
  src_data.data_in = varispeed_test::output;
  src_data.input_frames = 0x4000;
  local_78 = src_set_ratio((SRC_STATE *)src_data.src_ratio,1.0 / (double)src_data._48_8_);
  if (local_78 != 0) {
    pcVar1 = src_strerror(local_78);
    printf("\n\nLine %d : %s\n\n",0x95,pcVar1);
    exit(1);
  }
  local_78 = src_process((SRC_STATE *)src_data.src_ratio,(SRC_DATA *)&error);
  if (local_78 != 0) {
    pcVar1 = src_strerror(local_78);
    printf("\n\nLine %d : %s\n\n",0x9a,pcVar1);
    printf("  src_data.input_frames  : %ld\n",src_data.data_out);
    printf("  src_data.output_frames : %ld\n\n",src_data.input_frames);
    exit(1);
  }
  if (src_data.output_frames != (int)local_74) {
    printf("\n\nLine %d : unused input.\n",0xa1);
    printf("\tinput_len         : %d\n",(ulong)local_74);
    printf("\tinput_frames_used : %ld\n\n",src_data.output_frames);
    exit(1);
  }
  src_data.src_ratio = (double)src_delete((SRC_STATE *)src_data.src_ratio);
  dVar2 = calculate_snr(varispeed_test::output,(int)src_data.input_frames_used,1);
  if (dVar2 < sine_freq) {
    printf("\n\nLine %d : snr (%3.1f) does not meet target (%3.1f)\n\n",dVar2,sine_freq,0xac);
    save_oct_float("varispeed.mat",varispeed_test::input,(int)src_data.data_out,
                   varispeed_test::output,(int)src_data.input_frames_used);
    exit(1);
  }
  return;
}

Assistant:

static void
varispeed_test (int converter, double target_snr)
{	static float input [BUFFER_LEN], output [BUFFER_LEN] ;
	double sine_freq, snr ;

	SRC_STATE	*src_state ;
	SRC_DATA	src_data ;

	int input_len, error ;

	memset (input, 0, sizeof (input)) ;

	input_len = ARRAY_LEN (input) / 2 ;

	sine_freq = 0.0111 ;
	gen_windowed_sines (1, &sine_freq, 1.0, input, input_len) ;

	/* Perform sample rate conversion. */
	if ((src_state = src_new (converter, 1, &error)) == NULL)
	{	printf ("\n\nLine %d : src_new () failed : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	src_data.end_of_input = 1 ;

	src_data.data_in = input ;
	src_data.input_frames = input_len ;

	src_data.src_ratio = 3.0 ;

	src_data.data_out = output ;
	src_data.output_frames = ARRAY_LEN (output) ;

	if ((error = src_set_ratio (src_state, 1.0 / src_data.src_ratio)))
	{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	if ((error = src_process (src_state, &src_data)))
	{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
		printf ("  src_data.input_frames  : %ld\n", src_data.input_frames) ;
		printf ("  src_data.output_frames : %ld\n\n", src_data.output_frames) ;
		exit (1) ;
		} ;

	if (src_data.input_frames_used != input_len)
	{	printf ("\n\nLine %d : unused input.\n", __LINE__) ;
		printf ("\tinput_len         : %d\n", input_len) ;
		printf ("\tinput_frames_used : %ld\n\n", src_data.input_frames_used) ;
		exit (1) ;
		} ;

	/* Copy the last output to the input. */
	memcpy (input, output, sizeof (input)) ;
	reverse_data (input, src_data.output_frames_gen) ;

	if ((error = src_reset (src_state)))
	{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	src_data.end_of_input = 1 ;

	src_data.data_in = input ;
	input_len = src_data.input_frames = src_data.output_frames_gen ;

	src_data.data_out = output ;
	src_data.output_frames = ARRAY_LEN (output) ;

	if ((error = src_set_ratio (src_state, 1.0 / src_data.src_ratio)))
	{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	if ((error = src_process (src_state, &src_data)))
	{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
		printf ("  src_data.input_frames  : %ld\n", src_data.input_frames) ;
		printf ("  src_data.output_frames : %ld\n\n", src_data.output_frames) ;
		exit (1) ;
		} ;

	if (src_data.input_frames_used != input_len)
	{	printf ("\n\nLine %d : unused input.\n", __LINE__) ;
		printf ("\tinput_len         : %d\n", input_len) ;
		printf ("\tinput_frames_used : %ld\n\n", src_data.input_frames_used) ;
		exit (1) ;
		} ;

	src_state = src_delete (src_state) ;

	snr = calculate_snr (output, src_data.output_frames_gen, 1) ;

	if (target_snr > snr)
	{	printf ("\n\nLine %d : snr (%3.1f) does not meet target (%3.1f)\n\n", __LINE__, snr, target_snr) ;
		save_oct_float ("varispeed.mat", input, src_data.input_frames, output, src_data.output_frames_gen) ;
		exit (1) ;
		} ;

	return ;
}